

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

void __thiscall mkvparser::Cluster::Cluster(Cluster *this)

{
  this->m_entries = (BlockEntry **)0x0;
  this->m_entries_size = 0;
  this->m_element_size = 0;
  this->m_timecode = 0;
  this->m_index = 0;
  this->m_pos = 0;
  this->m_pSegment = (Segment *)0x0;
  this->m_element_start = 0;
  this->m_entries_count = 0;
  return;
}

Assistant:

Cluster::Cluster()
    : m_pSegment(NULL),
      m_element_start(0),
      m_index(0),
      m_pos(0),
      m_element_size(0),
      m_timecode(0),
      m_entries(NULL),
      m_entries_size(0),
      m_entries_count(0)  // means "no entries"
{}